

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

int google::protobuf::internal::WireFormatLite::TagSize(int field_number,FieldType type)

{
  int iVar1;
  
  iVar1 = io::CodedOutputStream::VarintSize32(field_number << 3);
  return iVar1 << (type == TYPE_GROUP);
}

Assistant:

inline int WireFormatLite::TagSize(int field_number,
                                   WireFormatLite::FieldType type) {
  int result = io::CodedOutputStream::VarintSize32(
    field_number << kTagTypeBits);
  if (type == TYPE_GROUP) {
    // Groups have both a start and an end tag.
    return result * 2;
  } else {
    return result;
  }
}